

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactCounters.h
# Opt level: O0

uint32 __thiscall
Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Get
          (CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields> *this,
          CounterFields typeEnum)

{
  Type TVar1;
  code *pcVar2;
  bool bVar3;
  Fields *pFVar4;
  Fields **ppFVar5;
  undefined4 *puVar6;
  uint local_18;
  uint32 value;
  uint8 localFieldSize;
  uint8 type;
  CounterFields typeEnum_local;
  CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields> *this_local;
  
  TVar1 = this->fieldSize;
  local_18 = 0;
  if (TVar1 == '\x01') {
    pFVar4 = Memory::
             WriteBarrierPtr<Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Fields>
             ::operator->(&this->fields);
    local_18 = (uint)(byte)pFVar4[typeEnum];
  }
  else if (TVar1 == '\x02') {
    pFVar4 = Memory::
             WriteBarrierPtr<Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Fields>
             ::operator->(&this->fields);
    local_18 = (uint)*(ushort *)(pFVar4 + (ulong)typeEnum * 2);
  }
  else if (TVar1 == '\x04') {
    pFVar4 = Memory::
             WriteBarrierPtr<Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Fields>
             ::operator->(&this->fields);
    local_18 = *(uint *)(pFVar4 + (ulong)typeEnum * 4);
  }
  else if ((TVar1 != '\0') ||
          (ppFVar5 = Memory::WriteBarrierPtr::operator_cast_to_Fields__
                               ((WriteBarrierPtr *)&this->fields), *ppFVar5 != (Fields *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CompactCounters.h"
                                ,0x46,"(localFieldSize == 0 && this->fields == nullptr)",
                                "localFieldSize == 0 && this->fields == nullptr");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  return local_18;
}

Assistant:

uint32 Get(CountT typeEnum) const
        {
            uint8 type = static_cast<uint8>(typeEnum);
            uint8 localFieldSize = fieldSize;
            uint32 value = 0;
            if (localFieldSize == 1)
            {
                value = this->fields->u8Fields[type];
            }
            else if (localFieldSize == 2)
            {
                value = this->fields->u16Fields[type];
            }
            else if (localFieldSize == 4)
            {
                value = this->fields->u32Fields[type];
            }
            else
            {
                Assert(localFieldSize == 0 && this->fields == nullptr); // OOM when initial allocation failed
            }

            return value;
        }